

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c++
# Opt level: O2

void capnp::compiler::anon_unknown_0::initGenericParams
               (Builder builder,
               Maybe<capnp::compiler::(anonymous_namespace)::Located<kj::Array<kj::Maybe<capnp::compiler::(anonymous_namespace)::Located<capnp::Text::Reader>_>_>_>_>
               *genericParameters)

{
  size_t sVar1;
  Maybe<capnp::compiler::(anonymous_namespace)::Located<capnp::Text::Reader>_> *pMVar2;
  ulong uVar3;
  ulong uVar4;
  Builder params;
  StructBuilder local_80;
  ListBuilder local_58;
  
  if ((genericParameters->ptr).isSet == true) {
    Declaration::Builder::initParameters
              ((Builder *)&local_58,&builder,*(uint *)((long)&(genericParameters->ptr).field_1 + 8))
    ;
    sVar1 = (genericParameters->ptr).field_1.value.value.size_;
    for (uVar4 = 0; sVar1 != uVar4; uVar4 = uVar4 + 1) {
      uVar3 = uVar4 & 0xffffffff;
      pMVar2 = (genericParameters->ptr).field_1.value.value.ptr;
      if (pMVar2[uVar3].ptr.isSet == true) {
        capnp::_::ListBuilder::getStructElement(&local_80,&local_58,(ElementCount)uVar4);
        Declaration::BrandParameter::Builder::setName
                  ((Builder *)&local_80,
                   (Reader)pMVar2[uVar3].ptr.field_1.value.value.super_StringPtr.content);
        *(undefined8 *)local_80.data = *(undefined8 *)((long)&pMVar2[uVar3].ptr.field_1 + 0x10);
      }
    }
  }
  return;
}

Assistant:

static void initGenericParams(Declaration::Builder builder,
    kj::Maybe<Located<kj::Array<kj::Maybe<Located<Text::Reader>>>>>&& genericParameters) {
  KJ_IF_SOME(p, genericParameters) {
    auto params = builder.initParameters(p.value.size());
    for (uint i: kj::indices(p.value)) {
      KJ_IF_SOME(name, p.value[i]) {
        auto param = params[i];
        param.setName(name.value);
        name.copyLocationTo(param);
      }
    }
  }
}